

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void patchJump(int offset)

{
  int iVar1;
  
  iVar1 = (current->function->chunk).count - offset;
  if (0x10001 < iVar1) {
    errorAt(&parser.previous,"Too much code to jump over.");
  }
  iVar1 = iVar1 + -2;
  (current->function->chunk).code[offset] = (uint8_t)((uint)iVar1 >> 8);
  (current->function->chunk).code[(long)offset + 1] = (uint8_t)iVar1;
  return;
}

Assistant:

static void patchJump(int offset) {
    // -2 to adjust for the bytecode for the jump offset itself.
    int jump = currentChunk()->count - offset - 2;

    // Set limitation for JUMP instruction
    if (jump > UINT16_MAX) {
        error("Too much code to jump over.");
    }

    currentChunk()->code[offset] = (jump >> 8) & 0xff;
    currentChunk()->code[offset + 1] = jump & 0xff;
}